

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

istream * spvtools::utils::
          ParseNormalFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
                    (istream *is,bool negate_value,
                    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                    *value)

{
  long lVar1;
  bool bVar2;
  uint_type uVar3;
  FloatProxy<double> FVar4;
  FloatProxy<double> val;
  
  bVar2 = RejectParseDueToLeadingSign<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
                    (is,negate_value,value);
  if (!bVar2) {
    operator>>(is,&val);
    if (negate_value) {
      val.data_ = val.data_ ^ 0x8000000000000000;
    }
    (value->value_).data_ = val.data_;
    lVar1 = *(long *)is;
    FVar4.data_ = val.data_;
    if ((((byte)is[*(long *)(lVar1 + -0x18) + 0x20] & 5) != 0) &&
       ((val.data_ & 0x7fffffffffffffff) == 0)) {
      (value->value_).data_ = 0;
      FVar4.data_ = 0;
    }
    if ((val.data_ & 0x7fffffffffffffff) == 0x7ff0000000000000) {
      uVar3 = ((ulong)(byte)~negate_value << 0x3f) + 0xffefffffffffffff;
      if ((long)FVar4.data_ < 0) {
        uVar3 = 0xffefffffffffffff;
      }
      (value->value_).data_ = uVar3;
      std::ios::setstate((int)*(undefined8 *)(lVar1 + -0x18) + (int)is);
    }
  }
  return is;
}

Assistant:

inline std::istream& ParseNormalFloat(std::istream& is, bool negate_value,
                                      HexFloat<T, Traits>& value) {
  if (RejectParseDueToLeadingSign(is, negate_value, value)) {
    return is;
  }
  T val;
  is >> val;
  if (negate_value) {
    val = -val;
  }
  value.set_value(val);
  // In the failure case, map -0.0 to 0.0.
  if (is.fail() && value.getUnsignedBits() == 0u) {
    value = HexFloat<T, Traits>(typename HexFloat<T, Traits>::uint_type{0});
  }
  if (val.isInfinity()) {
    // Fail the parse.  Emulate standard behaviour by setting the value to
    // the closest normal value, and set the fail bit on the stream.
    value.set_value((value.isNegative() | negate_value) ? T::lowest()
                                                        : T::max());
    is.setstate(std::ios_base::failbit);
  }
  return is;
}